

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O3

string * __thiscall
XrSdkLogObjectInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,XrSdkLogObjectInfo *this)

{
  ostringstream oVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  long lVar4;
  string out;
  ostringstream oss;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  uint64_t local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_198 = this->handle;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x12');
  *(undefined1 *)local_1b8 = 0x30;
  *(undefined1 *)((long)local_1b8 + 1) = 0x78;
  puVar2 = (undefined1 *)((long)local_1b8 + local_1b0 + -1);
  lVar4 = 0;
  do {
    oVar1 = local_190[lVar4 + -8];
    *puVar2 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[(byte)oVar1 & 0xf];
    puVar2[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[(byte)oVar1 >> 4];
    lVar4 = lVar4 + 1;
    puVar2 = puVar2 + -2;
  } while (lVar4 != 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(char *)local_1b8,local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if ((this->name)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," (",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->name)._M_dataplus._M_p,
                        (this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string XrSdkLogObjectInfo::ToString() const {
    std::ostringstream oss;
    oss << Uint64ToHexString(handle);
    if (!name.empty()) {
        oss << " (" << name << ")";
    }
    return oss.str();
}